

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::memq::~memq(memq *this)

{
  memq *this_local;
  
  ~memq(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      TEST_EQ("(2 3 4)", run("(memq 2 (list 1 2 3 4))"));
      TEST_EQ("#f", run("(memq 9 (list 1 2 3 4))"));
      TEST_EQ("(101 102)", run("(memq 101 '(100 101 102))"));

      TEST_EQ("#f", run("(memq 101 '((b a) (y x)))"));
      TEST_EQ("(a c)", run("(memq 'a '(b a c))"));
      TEST_EQ("#f", run("(memq '(y x) '((b a) (y x)))"));
      }